

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O1

HaU32 __thiscall
HACD::MyMergeHullsInterface::mergeHulls
          (MyMergeHullsInterface *this,MergeHullVector *inputHulls,MergeHullVector *outputHulls,
          HaU32 mergeHullCount,HaF32 smallClusterThreshold,HaU32 maxHullVertices)

{
  HaU32 HVar1;
  HaU32 HVar2;
  HaU32 guid;
  MergeHull *pMVar3;
  HaF32 *pHVar4;
  HaU32 *pHVar5;
  bool bVar6;
  uint uVar7;
  TestedMap *pTVar8;
  HashEntry *pHVar9;
  ChUll *pCVar10;
  size_t sVar11;
  char *__function;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  this->mGuid = 0;
  HVar1 = inputHulls->mSize;
  pTVar8 = (TestedMap *)malloc(0x1018);
  uVar12 = HVar1 * HVar1;
  memset(pTVar8,0,0x100c);
  pTVar8->mMaxEntries = uVar12;
  pHVar9 = (HashEntry *)malloc((ulong)uVar12 << 4);
  if (uVar12 != 0) {
    sVar11 = 0;
    do {
      *(undefined8 *)((long)&pHVar9->mNext + sVar11) = 0;
      sVar11 = sVar11 + 0x10;
    } while ((ulong)uVar12 << 4 != sVar11);
  }
  pTVar8->mEntries = pHVar9;
  this->mHasBeenTested = pTVar8;
  this->mSmallClusterThreshold = smallClusterThreshold;
  this->mMaxHullVertices = maxHullVertices;
  this->mMergeNumHulls = mergeHullCount;
  this->mTotalVolume = 0.0;
  if (inputHulls->mSize != 0) {
    lVar13 = 0x10;
    uVar14 = 0;
    do {
      pMVar3 = inputHulls->mData;
      pCVar10 = (ChUll *)malloc(0x40);
      HVar1 = *(HaU32 *)((long)pMVar3 + lVar13 + -0x10);
      HVar2 = *(HaU32 *)((long)pMVar3 + lVar13 + -0xc);
      pHVar4 = *(HaF32 **)((long)pMVar3 + lVar13 + -8);
      pHVar5 = *(HaU32 **)((long)&pMVar3->mTriangleCount + lVar13);
      guid = this->mGuid;
      this->mGuid = guid + 1;
      ChUll::ChUll(pCVar10,HVar2,pHVar4,HVar1,pHVar5,guid);
      uVar12 = (this->mChulls).mCapacity;
      uVar7 = uVar12 & 0x7fffffff;
      if (uVar7 <= (this->mChulls).mSize) {
        uVar12 = uVar12 * 2;
        if (uVar7 == 0) {
          uVar12 = 1;
        }
        if (uVar12 <= uVar7) {
          __function = "void hacd::vector<HACD::ChUll *>::grow(HaU32) [T = HACD::ChUll *]";
          goto LAB_0088fade;
        }
        hacd::vector<HACD::ChUll_*>::recreate(&this->mChulls,uVar12);
      }
      uVar12 = (this->mChulls).mSize;
      (this->mChulls).mData[uVar12] = pCVar10;
      (this->mChulls).mSize = uVar12 + 1;
      this->mTotalVolume = (HaF32)((float)pCVar10->mVolume + (float)this->mTotalVolume);
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x18;
    } while (uVar14 < inputHulls->mSize);
  }
  do {
    bVar6 = combineHulls(this);
  } while (bVar6);
  if ((this->mChulls).mSize != 0) {
    uVar14 = 0;
    do {
      pCVar10 = (this->mChulls).mData[uVar14];
      HVar1 = pCVar10->mVertexCount;
      HVar2 = pCVar10->mTriangleCount;
      pHVar5 = pCVar10->mIndices;
      pHVar4 = pCVar10->mVertices;
      uVar12 = outputHulls->mCapacity & 0x7fffffff;
      if (uVar12 <= outputHulls->mSize) {
        uVar7 = outputHulls->mCapacity * 2;
        if (uVar12 == 0) {
          uVar7 = 1;
        }
        if (uVar7 <= uVar12) {
          __function = "void hacd::vector<HACD::MergeHull>::grow(HaU32) [T = HACD::MergeHull]";
LAB_0088fade:
          __assert_fail("this->capacity() < capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                        ,0x208,__function);
        }
        hacd::vector<HACD::MergeHull>::recreate(outputHulls,uVar7);
      }
      pMVar3 = outputHulls->mData;
      uVar12 = outputHulls->mSize;
      pMVar3[uVar12].mTriangleCount = HVar2;
      pMVar3[uVar12].mVertexCount = HVar1;
      pMVar3[uVar12].mVertices = pHVar4;
      pMVar3[uVar12].mIndices = pHVar5;
      outputHulls->mSize = outputHulls->mSize + 1;
      uVar14 = uVar14 + 1;
    } while (uVar14 < (this->mChulls).mSize);
  }
  pTVar8 = this->mHasBeenTested;
  if (pTVar8 != (TestedMap *)0x0) {
    if (pTVar8->mEntries != (HashEntry *)0x0) {
      free(pTVar8->mEntries);
    }
    free(pTVar8);
  }
  return outputHulls->mSize;
}

Assistant:

virtual hacd::HaU32 mergeHulls(const MergeHullVector &inputHulls,
		MergeHullVector &outputHulls,
		hacd::HaU32 mergeHullCount,
		hacd::HaF32 smallClusterThreshold,
		hacd::HaU32 maxHullVertices)
	{
		mGuid = 0;

		HaU32 count = (HaU32)inputHulls.size();
		mHasBeenTested = HACD_NEW(TestedMap)(count*count);
		mSmallClusterThreshold = smallClusterThreshold;
		mMaxHullVertices = maxHullVertices;
		mMergeNumHulls = mergeHullCount;

		mTotalVolume = 0;
		for (HaU32 i=0; i<inputHulls.size(); i++)
		{
			const MergeHull &h = inputHulls[i];
			ChUll *ch = HACD_NEW(ChUll)(h.mVertexCount,h.mVertices,h.mTriangleCount,h.mIndices,mGuid++);
			mChulls.push_back(ch);
			mTotalVolume+=ch->mVolume;
		}

		for(;;)
		{
			bool combined = combineHulls(); // mege smallest hulls first, up to the max merge count.
			if ( !combined ) break;
		} 

		// return results..
		for (HaU32 i=0; i<mChulls.size(); i++)
		{
			ChUll *ch = mChulls[i];
			MergeHull mh;
			mh.mVertexCount = ch->mVertexCount;
			mh.mTriangleCount = ch->mTriangleCount;
			mh.mIndices = ch->mIndices;
			mh.mVertices = ch->mVertices;
			outputHulls.push_back(mh);
		}
		delete mHasBeenTested;
		return (HaU32)outputHulls.size();
	}